

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  float fVar2;
  uint uVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uchar uVar11;
  char *pcVar12;
  bool bVar13;
  double dVar14;
  undefined8 local_48;
  char **local_40;
  int local_34;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar9 = 1;
    bVar7 = greatest_info.flags;
    uVar11 = greatest_info.verbosity;
    local_40 = argv;
    local_34 = argc;
    do {
      pcVar12 = argv[iVar9];
      if (*pcVar12 != '-') goto LAB_00102ea1;
      iVar6 = (byte)pcVar12[1] - 0x65;
      switch(iVar6) {
      case 0:
switchD_00102e02_caseD_0:
        greatest_info.exact_name_match = '\x01';
        break;
      case 1:
switchD_00102e02_caseD_1:
        bVar7 = bVar7 | 1;
        greatest_info.flags = bVar7;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x10:
      case 0x12:
switchD_00102e02_caseD_2:
        iVar6 = strncmp("--help",pcVar12,6);
        if (iVar6 == 0) {
          pcVar12 = *local_40;
LAB_00103484:
          greatest_usage(pcVar12);
          exit(0);
        }
        iVar6 = strcmp("--",pcVar12);
        if (iVar6 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",pcVar12);
          pcVar12 = *local_40;
LAB_00103468:
          greatest_usage(pcVar12);
          exit(1);
        }
        bVar13 = false;
        argv = local_40;
        argc = local_34;
        goto LAB_00102e9d;
      case 3:
switchD_00102e02_caseD_3:
        pcVar12 = *argv;
        goto LAB_00103484;
      case 7:
switchD_00102e02_caseD_7:
        bVar7 = bVar7 | 2;
        greatest_info.flags = bVar7;
        break;
      case 0xe:
      case 0xf:
      case 0x13:
        iVar5 = iVar9 + 1;
        if (argc <= iVar5) {
          pcVar12 = *argv;
          goto LAB_00103468;
        }
        switch(iVar6) {
        case 0:
          goto switchD_00102e02_caseD_0;
        case 1:
          goto switchD_00102e02_caseD_1;
        case 2:
        case 4:
        case 5:
        case 6:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0x10:
        case 0x12:
          goto switchD_00102e02_caseD_2;
        case 3:
          goto switchD_00102e02_caseD_3;
        case 7:
          goto switchD_00102e02_caseD_7;
        case 0xe:
          greatest_info.suite_filter = argv[iVar5];
          break;
        case 0xf:
          greatest_info.test_filter = argv[iVar5];
          break;
        case 0x11:
          goto switchD_00102e02_caseD_11;
        case 0x13:
          greatest_info.test_exclude = argv[iVar5];
          break;
        default:
          goto switchD_00102e02_default;
        }
        bVar13 = true;
        iVar9 = iVar5;
        goto LAB_00102e9d;
      case 0x11:
switchD_00102e02_caseD_11:
        uVar11 = uVar11 + '\x01';
        greatest_info.verbosity = uVar11;
        break;
      default:
switchD_00102e02_default:
        if (pcVar12[1] != 0x61) goto switchD_00102e02_caseD_2;
        bVar7 = bVar7 | 4;
        greatest_info.flags = bVar7;
      }
      bVar13 = true;
LAB_00102e9d:
      if (!bVar13) break;
LAB_00102ea1:
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  iVar9 = greatest_test_pre("parsing_int32");
  if (iVar9 == 1) {
    pcVar12 = "\x01";
    uVar8 = 0;
    bVar13 = false;
    do {
      fVar2 = *(float *)(pcVar12 + -4);
      _Var4 = str_to_int32(*(char **)(pcVar12 + -0xc),(int32_t *)&local_48);
      if ((_Bool)*pcVar12 != _Var4) {
        greatest_info.fail_line = 0x5f;
        greatest_info.msg = "i32_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102f9b:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103440;
        iVar9 = -1;
        if (!bVar13) goto LAB_00102fc7;
        break;
      }
      uVar3 = greatest_info.assertions + 1;
      if ((_Var4) && (uVar3 = greatest_info.assertions + 2, fVar2 != (float)local_48)) {
        greatest_info.fail_line = 0x61;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102f9b;
      }
      greatest_info.assertions = uVar3;
      bVar13 = 0x18 < uVar8;
      uVar8 = uVar8 + 1;
      pcVar12 = pcVar12 + 0x10;
    } while (uVar8 != 0x1a);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00102fc7:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_float");
  if (iVar9 == 1) {
    lVar10 = 0xc;
    do {
      local_40 = (char **)CONCAT44(local_40._4_4_,*(undefined4 *)(&UNK_0010616c + lVar10));
      _Var4 = str_to_float(*(char **)(&UNK_00106164 + lVar10),(float *)&local_48);
      if ((_Bool)*(char *)((long)&parsing_float_float_tests + lVar10) != _Var4) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "float_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001030f5:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103440;
        iVar9 = -1;
        goto LAB_0010310e;
      }
      uVar3 = greatest_info.assertions + 1;
      if (_Var4) {
        dVar14 = (double)local_40._0_4_;
        greatest_info.assertions = greatest_info.assertions + 2;
        if ((((float)local_48 < local_40._0_4_) &&
            (9.999999747378752e-05 < dVar14 - (double)(float)local_48)) ||
           ((uVar3 = greatest_info.assertions, local_40._0_4_ < (float)local_48 &&
            (9.999999747378752e-05 < (double)(float)local_48 - dVar14)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",dVar14,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x10b;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_001030f5;
        }
      }
      greatest_info.assertions = uVar3;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x37c);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_0010310e:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_double");
  if (iVar9 == 1) {
    lVar10 = 0x10;
    do {
      local_40 = *(char ***)(&UNK_001064d8 + lVar10);
      _Var4 = str_to_double(*(char **)(&UNK_001064d0 + lVar10),(double *)&local_48);
      if ((_Bool)*(char *)((long)&parsing_double_double_tests + lVar10) != _Var4) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "double_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_0010322f:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103440;
        iVar9 = -1;
        goto LAB_00103248;
      }
      uVar3 = greatest_info.assertions + 1;
      if (_Var4) {
        dVar14 = (double)CONCAT44(local_48._4_4_,(float)local_48);
        greatest_info.assertions = greatest_info.assertions + 2;
        if (((dVar14 < (double)local_40) && (9.999999747378752e-05 < (double)local_40 - dVar14)) ||
           ((uVar3 = greatest_info.assertions, (double)local_40 < dVar14 &&
            (9.999999747378752e-05 < dVar14 - (double)local_40)))) {
          fprintf(_stdout,"\nExpected: %g +/- %g\n     Got: %g\n",local_40,0x3f1a36e2e0000000);
          greatest_info.fail_line = 0x170;
          greatest_info.msg = "expected != obtained +/- EPSILON";
          goto LAB_0010322f;
        }
      }
      greatest_info.assertions = uVar3;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x538);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00103248:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_usize");
  if (iVar9 == 1) {
    pcVar12 = "\x01";
    uVar8 = 0;
    bVar13 = false;
    do {
      lVar10 = *(long *)(pcVar12 + -8);
      _Var4 = str_to_usize(*(char **)(pcVar12 + -0x10),&local_48);
      if ((_Bool)*pcVar12 != _Var4) {
        greatest_info.fail_line = 0xa4;
        greatest_info.msg = "usize_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_00103305:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00103440;
        iVar9 = -1;
        if (!bVar13) goto LAB_00103331;
        break;
      }
      uVar3 = greatest_info.assertions + 1;
      if ((_Var4) &&
         (uVar3 = greatest_info.assertions + 2, lVar10 != CONCAT44(local_48._4_4_,(float)local_48)))
      {
        greatest_info.fail_line = 0xa6;
        greatest_info.msg = "expected != obtained";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00103305;
      }
      greatest_info.assertions = uVar3;
      bVar13 = 0x19 < uVar8;
      uVar8 = uVar8 + 1;
      pcVar12 = pcVar12 + 0x18;
    } while (uVar8 != 0x1b);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00103331:
    greatest_test_post(iVar9);
  }
  iVar9 = greatest_test_pre("parsing_bool");
  if (iVar9 == 1) {
    pcVar12 = "\x01";
    uVar8 = 0;
    bVar13 = false;
    do {
      cVar1 = pcVar12[-1];
      _Var4 = str_to_bool(*(char **)(pcVar12 + -9),(_Bool *)&local_48);
      if ((_Bool)*pcVar12 != _Var4) {
        greatest_info.fail_line = 0x1aa;
        greatest_info.msg = "bool_tests[i].expect_success != success";
        greatest_info.assertions = greatest_info.assertions + 1;
LAB_001033ee:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
        ;
        if ((greatest_info.flags & 4) != 0) {
LAB_00103440:
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parsing-utils.c"
          ;
          abort();
        }
        iVar9 = -1;
        if (!bVar13) goto LAB_00103416;
        break;
      }
      uVar3 = greatest_info.assertions + 1;
      if (_Var4) {
        uVar3 = greatest_info.assertions + 2;
        if ((_Bool)cVar1 != local_48._0_1_) {
          greatest_info.fail_line = 0x1ac;
          greatest_info.msg = "expected != obtained";
          greatest_info.assertions = greatest_info.assertions + 2;
          goto LAB_001033ee;
        }
      }
      greatest_info.assertions = uVar3;
      bVar13 = 0x11 < uVar8;
      uVar8 = uVar8 + 1;
      pcVar12 = pcVar12 + 0x10;
    } while (uVar8 != 0x13);
    greatest_info.msg = (char *)0x0;
    iVar9 = 0;
LAB_00103416:
    greatest_test_post(iVar9);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}